

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
TryAllocFromNewHeapBlock
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,size_t size,
          ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  undefined6 in_register_0000008a;
  AutoFilterExceptionRegion local_34 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_34,ExceptionType_All);
  if (0x3ff < (uint)CONCAT62(in_register_0000008a,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x242,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) goto LAB_006cddce;
    *puVar3 = 0;
  }
  if (((attributes & ClientTrackableObjectBits) == NoBit) &&
     ((this->super_HeapBucket).isPageHeapEnabled != false)) {
    pcVar4 = PageHeapAlloc(this,recycler,sizeCat,size,attributes,
                           ((this->super_HeapBucket).heapInfo)->pageHeapMode,true);
  }
  else {
    heapBlock = CreateHeapBlock(this,recycler);
    if (heapBlock != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      ::SetNew(allocator,heapBlock);
      if (InternalObjectInfoBitMask < attributes) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                           ,0xfe,"((attributes & InternalObjectInfoBitMask) == attributes)",
                           "(attributes & InternalObjectInfoBitMask) == attributes");
        if (!bVar2) goto LAB_006cddce;
        *puVar3 = 0;
      }
      pcVar4 = SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               ::InlinedAllocImpl<false>(allocator,recycler,sizeCat,attributes);
      if (pcVar4 != (char *)0x0) goto LAB_006cddb3;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x255,"(memBlock != nullptr || false)",
                         "memBlock != nullptr || IS_FAULTINJECT_NO_THROW_ON");
      if (!bVar2) {
LAB_006cddce:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pcVar4 = (char *)0x0;
  }
LAB_006cddb3:
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_34);
  return pcVar4;
}

Assistant:

char *
HeapBucketT<TBlockType>::TryAllocFromNewHeapBlock(Recycler * recycler, TBlockAllocatorType * allocator, size_t sizeCat, size_t size, ObjectInfoBits attributes)
{
    AUTO_NO_EXCEPTION_REGION;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

#ifdef RECYCLER_PAGE_HEAP
    if (IsPageHeapEnabled(attributes))
    {
        return this->PageHeapAlloc(recycler, sizeCat, size, attributes, this->heapInfo->pageHeapMode, true);
    }
#endif

    TBlockType * heapBlock = CreateHeapBlock(recycler);
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    // new heap block added, allocate from that.
    allocator->SetNew(heapBlock);
    // We just created a block we can allocate on
    char * memBlock = allocator->template SlowAlloc<false /* disallow fault injection */>(recycler, sizeCat, attributes);
    Assert(memBlock != nullptr || IS_FAULTINJECT_NO_THROW_ON);
    return memBlock;
}